

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CTransformFeedback::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CTransformFeedback *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  runtime_error *prVar7;
  bool compute;
  size_t i;
  ulong uVar8;
  allocator_type local_3e9;
  CColorArray coords;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uboData;
  CElementArray elements;
  CColorArray bufferTest;
  CColorArray bufferRef;
  GLchar *varyings [1];
  GLuint zeroes [5];
  DIResult result;
  DILogger local_1a0;
  
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,5,8,8,&coords);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glcts::(anonymous_namespace)::test_api::GL::glslVer_abi_cxx11_
            ((string *)&result,(GL *)0x0,compute);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uboData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "\nflat out highp uint dataOut;\nin vec4 i_vertex;\nlayout(std140) uniform  BLOCK {\n uint m[5];\n} b;\nvoid main() {\n  dataOut = b.m[min(4, gl_VertexID)];\n    gl_Position = i_vertex;\n}"
                );
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,fixed_sample_locations_values + 1,(allocator<char> *)&bufferRef);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&uboData,(string *)&result,
                     (string *)&elements,false);
  this->_program = GVar2;
  std::__cxx11::string::~string((string *)&elements);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&uboData);
  varyings[0] = "dataOut";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->_program,1,varyings,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar5 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar5 == 0) {
    result.status_ = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_vbo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               coords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    pGVar1 = &this->_ubo;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x50,(void *)0x0,0x88e4);
    GVar2 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,this->_program,"BLOCK");
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,GVar2,*pGVar1);
    uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->_drawFunc == DRAW_ELEMENTS) {
      result.logger_._0_8_ = (ulong)(uint)result.logger_._4_4_ << 0x20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&uboData,0x14,(value_type_conflict4 *)&result);
      *uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uint)((ulong)((long)coords.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)coords.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[4] = 1;
      uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[8] = 0;
      uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[0xc] = 0;
      puVar6 = uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 0x10;
    }
    else {
      if (this->_drawFunc != DRAW_ARRAYS) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Unknown draw function!");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      result.logger_._0_8_ = (ulong)(uint)result.logger_._4_4_ << 0x20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&uboData,0x10,(value_type_conflict4 *)&result);
      *uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uint)((ulong)((long)coords.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)coords.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[4] = 1;
      uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[8] = 0;
      puVar6 = uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 0xc;
    }
    *puVar6 = 0;
    glu::CallLogWrapper::glBufferSubData
              (this_00,0x8a11,0,
               (long)uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start,
               uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    result.logger_._0_8_ = result.logger_._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&elements,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type_conflict4 *)&result,
               (allocator_type *)&bufferRef);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = (uint)uVar8;
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,
               (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    pGVar1 = &this->_bufferIndirect;
    glu::CallLogWrapper::glGenBuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    zeroes[0] = 0;
    zeroes[1] = 0;
    zeroes[2] = 0;
    zeroes[3] = 0;
    zeroes[4] = 0;
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x14,zeroes,0x88e8);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*pGVar1);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,5);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    if (this->_drawFunc == DRAW_ARRAYS) {
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Unknown draw function!");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    result.logger_.null_log_ = true;
    result.logger_._1_7_ = 0x3e4ccccd3dcccc;
    result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef,(long)(iVar3 * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4)),
               (value_type *)&result,(allocator_type *)&bufferTest);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_02,iVar4) + 4);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferTest,(long)(iVar3 * iVar4),(value_type *)&result,&local_3e9);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_03,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar3,*(int *)(CONCAT44(extraout_var_04,iVar4) + 4)
               ,bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start);
    DIResult::DIResult(&result);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 4);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&bufferTest,widthTest,heightTest,&bufferRef,widthRef
                       ,*(uint *)(CONCAT44(extraout_var_08,iVar3) + 4));
    DIResult::sub_result(&local_1a0,&result,lVar5);
    DILogger::~DILogger(&local_1a0);
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&uboData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return result.status_;
}

Assistant:

long Run()
	{
		CColorArray coords;
		PrimitiveGen(GL_TRIANGLE_STRIP, 8, 8, coords);

		glClear(GL_COLOR_BUFFER_BIT);

		_program				 = CreateProgram(Vsh<api>(), "", shaders::fshSimple<api>(), false);
		const GLchar* varyings[] = { "dataOut" };
		glTransformFeedbackVaryings(_program, 1, varyings, GL_INTERLEAVED_ATTRIBS);
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenBuffers(1, &_vbo);
		glBindBuffer(GL_ARRAY_BUFFER, _vbo);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ubo);
		glBindBuffer(GL_UNIFORM_BUFFER, _ubo);
		glBufferData(GL_UNIFORM_BUFFER, 4 * 5 * sizeof(GLuint), NULL, GL_STATIC_DRAW);
		glBindBufferBase(GL_UNIFORM_BUFFER, glGetUniformBlockIndex(_program, "BLOCK"), _ubo);
		std::vector<GLuint> uboData;

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			uboData.resize(4 * 4, 0);

			uboData[0]  = static_cast<GLuint>(coords.size()); //count
			uboData[4]  = 1;								  //primcount
			uboData[8]  = 0;								  //first
			uboData[12] = 0;								  //mbz
		}
		break;
		case DRAW_ELEMENTS:
		{
			uboData.resize(4 * 5, 0);
			uboData[0]  = static_cast<GLuint>(coords.size()); //count
			uboData[4]  = 1;								  //primcount
			uboData[8]  = 0;								  //firstindex
			uboData[12] = 0;								  //basevertex
			uboData[16] = 0;								  //mbz
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}
		glBufferSubData(GL_UNIFORM_BUFFER, 0, (GLsizeiptr)(uboData.size() * sizeof(uboData[0])), &uboData[0]);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glGenBuffers(1, &_bufferIndirect);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, _bufferIndirect);
		GLuint zeroes[] = { 0, 0, 0, 0, 0 };
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(zeroes), zeroes, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);

		glEnable(GL_RASTERIZER_DISCARD);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArrays(GL_POINTS, 0, 5);
		glEndTransformFeedback();
		glDisable(GL_RASTERIZER_DISCARD);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
			glDrawArraysIndirect(GL_TRIANGLES, 0);
			break;
		case DRAW_ELEMENTS:
			glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);

			break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);

		DIResult result;
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}